

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad-helpers.c
# Opt level: O3

void pcap_freealldevs(pcap_if_t *alldevs)

{
  pcap_if *ppVar1;
  pcap_addr *ppVar2;
  pcap_addr *__ptr;
  pcap_if_t *curdev;
  
  if (alldevs != (pcap_if_t *)0x0) {
    do {
      ppVar1 = alldevs->next;
      __ptr = alldevs->addresses;
      while (__ptr != (pcap_addr *)0x0) {
        ppVar2 = __ptr->next;
        if (__ptr->addr != (sockaddr *)0x0) {
          free(__ptr->addr);
        }
        if (__ptr->netmask != (sockaddr *)0x0) {
          free(__ptr->netmask);
        }
        if (__ptr->broadaddr != (sockaddr *)0x0) {
          free(__ptr->broadaddr);
        }
        if (__ptr->dstaddr != (sockaddr *)0x0) {
          free(__ptr->dstaddr);
        }
        free(__ptr);
        __ptr = ppVar2;
      }
      free(alldevs->name);
      if (alldevs->description != (char *)0x0) {
        free(alldevs->description);
      }
      free(alldevs);
      alldevs = ppVar1;
    } while (ppVar1 != (pcap_if *)0x0);
  }
  return;
}

Assistant:

void
pcap_freealldevs(pcap_if_t *alldevs)
{
	pcap_if_t *curdev, *nextdev;
	pcap_addr_t *curaddr, *nextaddr;

	for (curdev = alldevs; curdev != NULL; curdev = nextdev) {
		nextdev = curdev->next;

		/*
		 * Free all addresses.
		 */
		for (curaddr = curdev->addresses; curaddr != NULL; curaddr = nextaddr) {
			nextaddr = curaddr->next;
			if (curaddr->addr)
				free(curaddr->addr);
			if (curaddr->netmask)
				free(curaddr->netmask);
			if (curaddr->broadaddr)
				free(curaddr->broadaddr);
			if (curaddr->dstaddr)
				free(curaddr->dstaddr);
			free(curaddr);
		}

		/*
		 * Free the name string.
		 */
		free(curdev->name);

		/*
		 * Free the description string, if any.
		 */
		if (curdev->description != NULL)
			free(curdev->description);

		/*
		 * Free the interface.
		 */
		free(curdev);
	}
}